

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ReflectionTester
          (ReflectionTester *this,Descriptor *base_descriptor)

{
  DescriptorPool *this_00;
  size_t sVar1;
  char *pcVar2;
  string *psVar3;
  pointer pcVar4;
  short *psVar5;
  FieldDescriptor *pFVar6;
  Descriptor *pDVar7;
  EnumValueDescriptor *pEVar8;
  AlphaNum *pAVar9;
  char *in_R9;
  internal iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  AssertHelper local_c0;
  string local_b8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  string local_68;
  AlphaNum *local_38;
  
  this->base_descriptor_ = base_descriptor;
  pAVar9 = (AlphaNum *)base_descriptor->file_->package_;
  this_00 = base_descriptor->file_->pool_;
  sVar1 = (pAVar9->piece_)._M_len;
  pcVar2 = (pAVar9->piece_)._M_str;
  local_98 = (undefined1  [8])0x25;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e4148;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name._M_str = local_b8._M_dataplus._M_p;
  name._M_len = local_b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  pDVar7 = FieldDescriptor::message_type(pFVar6);
  psVar3 = pDVar7->file_->package_;
  pAVar9 = (AlphaNum *)(psVar3->_M_dataplus)._M_p;
  pcVar4 = (pointer)psVar3->_M_string_length;
  local_98 = (undefined1  [8])0x1e;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e416e;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  local_38 = pAVar9;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_00._M_str = local_b8._M_dataplus._M_p;
  name_00._M_len = local_b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_00);
  this->nested_b_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])0x11;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e418d;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_01._M_str = local_b8._M_dataplus._M_p;
  name_01._M_len = local_b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_01);
  this->foreign_c_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68._M_string_length = (size_type)local_38;
  local_98 = (undefined1  [8])0x10;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e419f;
  local_68._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_02._M_str = local_b8._M_dataplus._M_p;
  name_02._M_len = local_b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_02);
  this->import_d_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68._M_string_length = (size_type)local_38;
  local_98 = (undefined1  [8])0x16;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e41b0;
  local_68._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_03._M_str = local_b8._M_dataplus._M_p;
  name_03._M_len = local_b8._M_string_length;
  pFVar6 = DescriptorPool::FindFieldByName(this_00,name_03);
  this->import_e_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])0x11;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e41c7;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_04._M_str = local_b8._M_dataplus._M_p;
  name_04._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_04);
  this->nested_foo_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])0x11;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e41d9;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_05._M_str = local_b8._M_dataplus._M_p;
  name_05._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_05);
  this->nested_bar_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])0x11;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e41eb;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_06._M_str = local_b8._M_dataplus._M_p;
  name_06._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_06);
  this->nested_baz_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])0xc;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e41fd;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_07._M_str = local_b8._M_dataplus._M_p;
  name_07._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_07);
  this->foreign_foo_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])0xc;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e420a;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_08._M_str = local_b8._M_dataplus._M_p;
  name_08._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_08);
  this->foreign_bar_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98 = (undefined1  [8])0xc;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e4217;
  local_68._M_dataplus._M_p = pcVar2;
  local_68._M_string_length = sVar1;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_09._M_str = local_b8._M_dataplus._M_p;
  name_09._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_09);
  this->foreign_baz_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68._M_string_length = (size_type)local_38;
  local_98 = (undefined1  [8])0xb;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e4224;
  local_68._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_10._M_str = local_b8._M_dataplus._M_p;
  name_10._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_10);
  this->import_foo_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68._M_string_length = (size_type)local_38;
  local_98 = (undefined1  [8])0xb;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e4230;
  local_68._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_11._M_str = local_b8._M_dataplus._M_p;
  name_11._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_11);
  this->import_bar_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_68._M_string_length = (size_type)local_38;
  local_98 = (undefined1  [8])0xb;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e423c;
  local_68._M_dataplus._M_p = pcVar4;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
  name_12._M_str = local_b8._M_dataplus._M_p;
  name_12._M_len = local_b8._M_string_length;
  pEVar8 = DescriptorPool::FindEnumValueByName(this_00,name_12);
  this->import_baz_ = pEVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  psVar5 = (short *)(this->base_descriptor_->all_names_).payload_;
  if ((*psVar5 == 0x11) &&
     (auVar11[0] = -((char)psVar5[-9] == 'T'),
     auVar11[1] = -(*(char *)((long)psVar5 + -0x11) == 'e'), auVar11[2] = -((char)psVar5[-8] == 's')
     , auVar11[3] = -(*(char *)((long)psVar5 + -0xf) == 't'),
     auVar11[4] = -((char)psVar5[-7] == 'A'), auVar11[5] = -(*(char *)((long)psVar5 + -0xd) == 'l'),
     auVar11[6] = -((char)psVar5[-6] == 'l'), auVar11[7] = -(*(char *)((long)psVar5 + -0xb) == 'E'),
     auVar11[8] = -((char)psVar5[-5] == 'x'), auVar11[9] = -(*(char *)((long)psVar5 + -9) == 't'),
     auVar11[10] = -((char)psVar5[-4] == 'e'), auVar11[0xb] = -(*(char *)((long)psVar5 + -7) == 'n')
     , auVar11[0xc] = -((char)psVar5[-3] == 's'),
     auVar11[0xd] = -(*(char *)((long)psVar5 + -5) == 'i'),
     auVar11[0xe] = -((char)psVar5[-2] == 'o'),
     auVar11[0xf] = -(*(char *)((long)psVar5 + -3) == 'n'), auVar12[0] = -((char)psVar5[-1] == 's'),
     auVar12[1] = 0xff, auVar12[2] = 0xff, auVar12[3] = 0xff, auVar12[4] = 0xff, auVar12[5] = 0xff,
     auVar12[6] = 0xff, auVar12[7] = 0xff, auVar12[8] = 0xff, auVar12[9] = 0xff, auVar12[10] = 0xff,
     auVar12[0xb] = 0xff, auVar12[0xc] = 0xff, auVar12[0xd] = 0xff, auVar12[0xe] = 0xff,
     auVar12[0xf] = 0xff, auVar12 = auVar12 & auVar11,
     (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff)) {
    local_98 = (undefined1  [8])0x1a;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e4248;
    local_68._M_dataplus._M_p = pcVar2;
    local_68._M_string_length = sVar1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
    name_15._M_str = local_b8._M_dataplus._M_p;
    name_15._M_len = local_b8._M_string_length;
    pFVar6 = DescriptorPool::FindFieldByName(this_00,name_15);
    this->group_a_ = pFVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_98 = (undefined1  [8])0x1a;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e4263;
    local_68._M_dataplus._M_p = pcVar2;
    local_68._M_string_length = sVar1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
    name_16._M_str = local_b8._M_dataplus._M_p;
    name_16._M_len = local_b8._M_string_length;
    pFVar6 = DescriptorPool::FindFieldByName(this_00,name_16);
  }
  else {
    local_98 = (undefined1  [8])0x1d;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e427e;
    local_68._M_dataplus._M_p = pcVar2;
    local_68._M_string_length = sVar1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
    name_13._M_str = local_b8._M_dataplus._M_p;
    name_13._M_len = local_b8._M_string_length;
    pFVar6 = DescriptorPool::FindFieldByName(this_00,name_13);
    this->group_a_ = pFVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_98 = (undefined1  [8])0x1d;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e429c;
    local_68._M_dataplus._M_p = pcVar2;
    local_68._M_string_length = sVar1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b8,(lts_20250127 *)&local_68,(AlphaNum *)local_98,pAVar9);
    name_14._M_str = local_b8._M_dataplus._M_p;
    name_14._M_len = local_b8._M_string_length;
    pFVar6 = DescriptorPool::FindFieldByName(this_00,name_14);
  }
  this->repeated_group_a_ = pFVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar10 = (internal)(this->group_a_ != (FieldDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)iVar10) {
    local_98[0] = iVar10;
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)0x10e42c3,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x96,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->repeated_group_a_ != (FieldDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"repeated_group_a_ != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x97,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->nested_b_ != (FieldDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"nested_b_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x98,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->foreign_c_ != (FieldDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"foreign_c_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x99,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->import_d_ != (FieldDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"import_d_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9a,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->import_e_ != (FieldDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"import_e_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9b,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->nested_foo_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"nested_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9c,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->nested_bar_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"nested_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9d,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->nested_baz_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"nested_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9e,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->foreign_foo_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"foreign_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9f,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->foreign_bar_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"foreign_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa0,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->foreign_baz_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"foreign_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa1,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->import_foo_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"import_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa2,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->import_bar_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"import_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa3,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_98[0] = (internal)(this->import_baz_ != (EnumValueDescriptor *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_98,(AssertionResult *)"import_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa4,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  return;
}

Assistant:

inline TestUtil::ReflectionTester::ReflectionTester(
    const Descriptor* base_descriptor)
    : base_descriptor_(base_descriptor) {
  const DescriptorPool* pool = base_descriptor->file()->pool();
  const absl::string_view package = base_descriptor->file()->package();
  const FieldDescriptor* import_descriptor = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.optional_import_message"));
  const absl::string_view import_package =
      import_descriptor->message_type()->file()->package();

  nested_b_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.NestedMessage.bb"));
  foreign_c_ =
      pool->FindFieldByName(absl::StrCat(package, ".ForeignMessage.c"));
  import_d_ =
      pool->FindFieldByName(absl::StrCat(import_package, ".ImportMessage.d"));
  import_e_ = pool->FindFieldByName(
      absl::StrCat(import_package, ".PublicImportMessage.e"));
  nested_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.FOO"));
  nested_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAR"));
  nested_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAZ"));
  foreign_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_FOO"));
  foreign_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAR"));
  foreign_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAZ"));
  import_foo_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_FOO"));
  import_bar_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAR"));
  import_baz_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAZ"));

  if (base_descriptor_->name() == "TestAllExtensions") {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".OptionalGroup_extension.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".RepeatedGroup_extension.a"));
  } else {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.OptionalGroup.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.RepeatedGroup.a"));
  }

  EXPECT_TRUE(group_a_ != nullptr);
  EXPECT_TRUE(repeated_group_a_ != nullptr);
  EXPECT_TRUE(nested_b_ != nullptr);
  EXPECT_TRUE(foreign_c_ != nullptr);
  EXPECT_TRUE(import_d_ != nullptr);
  EXPECT_TRUE(import_e_ != nullptr);
  EXPECT_TRUE(nested_foo_ != nullptr);
  EXPECT_TRUE(nested_bar_ != nullptr);
  EXPECT_TRUE(nested_baz_ != nullptr);
  EXPECT_TRUE(foreign_foo_ != nullptr);
  EXPECT_TRUE(foreign_bar_ != nullptr);
  EXPECT_TRUE(foreign_baz_ != nullptr);
  EXPECT_TRUE(import_foo_ != nullptr);
  EXPECT_TRUE(import_bar_ != nullptr);
  EXPECT_TRUE(import_baz_ != nullptr);
}